

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

VariableP<tcu::Vector<int,_4>_> __thiscall
vkt::shaderexecutor::variable<tcu::Vector<int,4>>(shaderexecutor *this,string *name)

{
  Variable<tcu::Vector<int,_4>_> *this_00;
  SharedPtrStateBase *extraout_RDX;
  VariableP<tcu::Vector<int,_4>_> VVar1;
  
  this_00 = (Variable<tcu::Vector<int,_4>_> *)operator_new(0x28);
  Variable<tcu::Vector<int,_4>_>::Variable(this_00,name);
  de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_4>_>_>::SharedPtr
            ((SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_4>_>_> *)this,this_00);
  VVar1.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_4>_>_>.m_state =
       extraout_RDX;
  VVar1.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_4>_>_>.m_ptr =
       (Variable<tcu::Vector<int,_4>_> *)this;
  return (VariableP<tcu::Vector<int,_4>_>)
         VVar1.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_4>_>_>;
}

Assistant:

VariableP<T> variable (const string& name)
{
	return VariableP<T>(new Variable<T>(name));
}